

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O3

SW_FT_Error
ft_stroke_border_get_counts
          (SW_FT_StrokeBorder border,SW_FT_UInt *anum_points,SW_FT_UInt *anum_contours)

{
  byte bVar1;
  SW_FT_UInt SVar2;
  SW_FT_UInt SVar3;
  SW_FT_UInt SVar4;
  SW_FT_UInt SVar5;
  long lVar6;
  bool bVar7;
  
  SVar2 = border->num_points;
  if (SVar2 == 0) {
    SVar4 = 0;
  }
  else {
    SVar3 = 0;
    lVar6 = 0;
    bVar7 = false;
    SVar4 = 0;
    do {
      bVar1 = border->tags[lVar6];
      if (((bVar1 & 4) == 0) == !bVar7) {
        SVar5 = 0;
        goto LAB_0010bfd0;
      }
      bVar7 = (bVar1 & 8) == 0;
      SVar4 = SVar4 + ((bVar1 & 8) >> 3);
      lVar6 = lVar6 + 1;
    } while (SVar2 != (SW_FT_UInt)lVar6);
    SVar5 = 0;
    if ((char)(bVar1 & 8) == '\0') goto LAB_0010bfd0;
  }
  border->valid = '\x01';
  SVar3 = SVar2;
  SVar5 = SVar4;
LAB_0010bfd0:
  *anum_points = SVar3;
  *anum_contours = SVar5;
  return SVar2;
}

Assistant:

static SW_FT_Error ft_stroke_border_get_counts(SW_FT_StrokeBorder border,
                                               SW_FT_UInt*        anum_points,
                                               SW_FT_UInt*        anum_contours)
{
    SW_FT_Error error = 0;
    SW_FT_UInt  num_points = 0;
    SW_FT_UInt  num_contours = 0;

    SW_FT_UInt    count = border->num_points;
    SW_FT_Vector* point = border->points;
    SW_FT_Byte*   tags = border->tags;
    SW_FT_Int     in_contour = 0;

    for (; count > 0; count--, num_points++, point++, tags++) {
        if (tags[0] & SW_FT_STROKE_TAG_BEGIN) {
            if (in_contour != 0) goto Fail;

            in_contour = 1;
        } else if (in_contour == 0)
            goto Fail;

        if (tags[0] & SW_FT_STROKE_TAG_END) {
            in_contour = 0;
            num_contours++;
        }
    }

    if (in_contour != 0) goto Fail;

    border->valid = TRUE;

Exit:
    *anum_points = num_points;
    *anum_contours = num_contours;
    return error;

Fail:
    num_points = 0;
    num_contours = 0;
    goto Exit;
}